

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O0

void finish(stagewise_poly *poly)

{
  features::delete_v((features *)poly);
  v_array<unsigned_char>::delete_v((v_array<unsigned_char> *)poly);
  sort_data_destroy((stagewise_poly *)0x2a0053);
  depthsbits_destroy((stagewise_poly *)0x2a005c);
  return;
}

Assistant:

void finish(stagewise_poly &poly)
{
#ifdef DEBUG
  cout << "total feature number (after poly expansion!) = " << poly.sum_sparsity << endl;
#endif  // DEBUG

  poly.synth_ec.feature_space[tree_atomics].delete_v();
  poly.synth_ec.indices.delete_v();
  sort_data_destroy(poly);
  depthsbits_destroy(poly);
}